

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixellayout.cpp
# Opt level: O1

QRgbaFloat32 *
fetchRGBToRGB32F<(QImage::Format)7>
          (QRgbaFloat32 *buffer,uchar *src,int index,int count,QList<unsigned_int> *param_5,
          QDitherInfo *param_6)

{
  float *pfVar1;
  ushort uVar2;
  long lVar3;
  
  if (0 < count) {
    lVar3 = 0;
    do {
      uVar2 = *(ushort *)(src + lVar3 + (long)index * 2);
      pfVar1 = &buffer->r + lVar3 * 2;
      *pfVar1 = (float)((uint)(uVar2 >> 0xb) * 0x84000 >> 0x10) * 0.003921569;
      pfVar1[1] = (float)((uVar2 >> 1 & 0x300 | (uVar2 & 0x7e0) << 5) >> 8) * 0.003921569;
      pfVar1[2] = (float)((uVar2 >> 2 & 7) + uVar2 * 8 & 0xff) * 0.003921569;
      pfVar1[3] = 1.0;
      lVar3 = lVar3 + 2;
    } while ((ulong)(uint)count * 2 != lVar3);
  }
  return buffer;
}

Assistant:

static const QRgbaFloat32 *QT_FASTCALL fetchRGBToRGB32F(QRgbaFloat32 *buffer, const uchar *src, int index, int count,
                                                    const QList<QRgb> *, QDitherInfo *)
{
    for (int i = 0; i < count; ++i)
        buffer[i] = convertPixelToRGB32F<Format>(fetchPixel<bitsPerPixel<Format>()>(src, index + i));
    return buffer;
}